

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void factor(Vm *vm)

{
  TokenType TVar1;
  Vm *vm_local;
  
  TVar1 = (vm->compiler).token.type;
  if (TVar1 == TOKEN_MINUS) {
    advance(vm);
    power(vm);
    emit_no_arg(vm,OP_NEGATE);
  }
  else if (TVar1 == TOKEN_BANG) {
    advance(vm);
    power(vm);
    emit_no_arg(vm,OP_NOT);
  }
  else {
    power(vm);
  }
  return;
}

Assistant:

static void factor(Vm *vm) {
    switch (vm->compiler.token.type) {
        case TOKEN_BANG:
            advance(vm);
            power(vm);
            emit_no_arg(vm, OP_NOT);
            break;
        case TOKEN_MINUS:
            advance(vm);
            power(vm);
            emit_no_arg(vm, OP_NEGATE);
            break;
        default:
            power(vm);
            break;
    }
}